

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

size_type __thiscall
slang::SmallVectorBase<const_slang::ast::Constraint_*>::calculateGrowth
          (SmallVectorBase<const_slang::ast::Constraint_*> *this,size_type newSize)

{
  size_type doubled;
  size_type max;
  size_type newSize_local;
  SmallVectorBase<const_slang::ast::Constraint_*> *this_local;
  
  this_local = (SmallVectorBase<const_slang::ast::Constraint_*> *)max_size(this);
  if ((this->cap <= (long)this_local - this->cap) &&
     (this_local = (SmallVectorBase<const_slang::ast::Constraint_*> *)(this->cap << 1),
     this_local < newSize)) {
    this_local = (SmallVectorBase<const_slang::ast::Constraint_*> *)newSize;
  }
  return (size_type)this_local;
}

Assistant:

constexpr size_type calculateGrowth(size_type newSize) const {
        const auto max = max_size();
        if (cap > max - cap)
            return max;

        const size_type doubled = cap * 2;
        if (doubled < newSize)
            return newSize;

        return doubled;
    }